

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O0

void qrsolv(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double *x,double *sdiag)

{
  int iVar1;
  void *__ptr;
  double dVar2;
  double dVar3;
  double *wa;
  double zero;
  double temp;
  double tan;
  double sum;
  double sin;
  double qtbpj;
  double p25;
  double p5;
  double cotan;
  double cos;
  int t;
  int nsing;
  int l;
  int kp1;
  int k;
  int jp1;
  int j;
  int i;
  double *qtb_local;
  double *diag_local;
  int *ipvt_local;
  int N_local;
  int ldr_local;
  double *r_local;
  
  __ptr = malloc((long)N << 3);
  for (k = 0; k < N; k = k + 1) {
    for (jp1 = k; jp1 < N; jp1 = jp1 + 1) {
      r[jp1 * N + k] = r[k * N + jp1];
    }
    x[k] = r[k * N + k];
    *(double *)((long)__ptr + (long)k * 8) = qtb[k];
  }
  for (k = 0; k < N; k = k + 1) {
    iVar1 = ipvt[k];
    if ((diag[iVar1] != 0.0) || (NAN(diag[iVar1]))) {
      for (l = k; l < N; l = l + 1) {
        sdiag[l] = 0.0;
      }
      sdiag[k] = diag[iVar1];
      sin = 0.0;
      for (l = k; l < N; l = l + 1) {
        iVar1 = l * N;
        if ((sdiag[l] != 0.0) || (NAN(sdiag[l]))) {
          if (ABS(sdiag[l]) <= ABS(r[iVar1 + l])) {
            dVar2 = sdiag[l] / r[iVar1 + l];
            dVar3 = sqrt(dVar2 * 0.25 * dVar2 + 0.25);
            cotan = 0.5 / dVar3;
            sum = cotan * dVar2;
          }
          else {
            dVar2 = r[iVar1 + l] / sdiag[l];
            dVar3 = sqrt(dVar2 * 0.25 * dVar2 + 0.25);
            sum = 0.5 / dVar3;
            cotan = sum * dVar2;
          }
          r[iVar1 + l] = cotan * r[iVar1 + l] + sum * sdiag[l];
          dVar2 = sum * sin;
          sin = -sum * *(double *)((long)__ptr + (long)l * 8) + cotan * sin;
          *(double *)((long)__ptr + (long)l * 8) =
               cotan * *(double *)((long)__ptr + (long)l * 8) + dVar2;
          jp1 = l;
          if (l + 2 <= N) {
            while (jp1 = jp1 + 1, jp1 < N) {
              dVar2 = r[jp1 * N + l];
              dVar3 = sdiag[jp1];
              sdiag[jp1] = -sum * r[jp1 * N + l] + cotan * sdiag[jp1];
              r[jp1 * N + l] = cotan * dVar2 + sum * dVar3;
            }
          }
        }
      }
    }
    sdiag[k] = r[k * N + k];
    r[k * N + k] = x[k];
  }
  cos._4_4_ = N;
  for (k = 1; k <= N; k = k + 1) {
    if (((sdiag[k + -1] == 0.0) && (!NAN(sdiag[k + -1]))) && (cos._4_4_ == N)) {
      cos._4_4_ = k + -1;
    }
    if (cos._4_4_ < N) {
      *(undefined8 *)((long)__ptr + (long)(k + -1) * 8) = 0;
    }
  }
  if (0 < cos._4_4_) {
    for (l = 1; l <= cos._4_4_; l = l + 1) {
      iVar1 = cos._4_4_ - l;
      tan = 0.0;
      jp1 = iVar1 + 2;
      if (jp1 <= cos._4_4_) {
        for (; jp1 <= cos._4_4_; jp1 = jp1 + 1) {
          tan = r[(jp1 + -1) * N + iVar1] * *(double *)((long)__ptr + (long)(jp1 + -1) * 8) + tan;
        }
      }
      *(double *)((long)__ptr + (long)iVar1 * 8) =
           (*(double *)((long)__ptr + (long)iVar1 * 8) - tan) / sdiag[iVar1];
    }
  }
  for (k = 0; k < N; k = k + 1) {
    x[ipvt[k]] = *(double *)((long)__ptr + (long)k * 8);
  }
  free(__ptr);
  return;
}

Assistant:

void qrsolv(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double *x,double *sdiag) {
	int i,j,jp1,k,kp1,l,nsing,t;
	double cos,cotan,p5,p25,qtbpj,sin,sum,tan,temp,zero;
	double *wa;

	/*
	 *   This routine is a C translation of Fortran Code by
     *     argonne national laboratory. minpack project. march 1980.
      	  burton s. garbow, kenneth e. hillstrom, jorge j. more
	 * N is a positive integer input variable set to the order of r.

       r is an N by N array. on input the full upper triangle
         must contain the full upper triangle of the matrix r.
         on output the full upper triangle is unaltered, and the
         strict lower triangle contains the strict upper triangle
         (transposed) of the upper triangular matrix s.

       ldr is a positive integer input variable not less than n
         which specifies the leading dimension of the array r.

       ipvt is an integer input array of length N which defines the
         permutation matrix p such that a*p = q*r. column j of p
         is column ipvt(j) of the identity matrix.

       diag is an input array of length N which must contain the
         diagonal elements of the matrix d.

       qtb is an input array of length N which must contain the first
         N elements of the vector (q transpose)*b.

       x is an output array of length N which contains the least
         squares solution of the system a*x = b, d*x = 0.

       sdiag is an output array of length N which contains the
         diagonal elements of the upper triangular matrix s.
	 */

	wa = (double*) malloc(sizeof(double) *N);

	p5 = 5.0e-1;
	p25 = 2.5e-1;
	zero = 0.0;

	//     copy r and (q transpose)*b to preserve input and initialize s.
	//     in particular, save the diagonal elements of r in x.

	for(j = 0; j < N;++j) {
		for(i = j; i < N;++i) {
			r[i*N+j] = r[j*N+i];
		}
		x[j] = r[j*N+j];
		wa[j] = qtb[j];
	}

	//eliminate the diagonal matrix d using a givens rotation.

	for(j = 0; j < N;++j) { //100

		//        prepare the row of d to be eliminated, locating the
		//        diagonal element using p from the qr factorization.

		l = ipvt[j];

		if (diag[l] != zero) { //90
			for(k = j; k < N;++k) {
				sdiag[k] = zero;
			}

			sdiag[j] = diag[l];

			//        the transformations to eliminate the row of d
			//        modify only a single element of (q transpose)*b
			//        beyond the first n, which is initially zero.

			qtbpj = zero;

			for(k = j; k < N;++k) { //80
				t = k * N;
				//     determine a givens rotation which eliminates the
				//     appropriate element in the current row of d.

				if (sdiag[k] != zero) { //70
					if (fabs(r[t+k]) < fabs(sdiag[k])) {
						cotan = r[t+k]/sdiag[k];
			            sin = p5/sqrt(p25+p25*cotan*cotan);
			            cos = sin*cotan;
					} else {
			            tan = sdiag[k]/r[t+k];
			            cos = p5/sqrt(p25+p25*tan*tan);
			            sin = cos*tan;
					}
					//           compute the modified diagonal element of r and
					//           the modified element of ((q transpose)*b,0).
		            r[t+k] = cos*r[t+k] + sin*sdiag[k];
		            temp = cos*wa[k] + sin*qtbpj;
		            qtbpj = -sin*wa[k] + cos*qtbpj;
		            wa[k] = temp;

		            //           accumulate the tranformation in the row of s.
		            kp1 = k + 1;

		            if (N >= kp1+1) {//71
		            	for(i = kp1;i < N;++i) {
		                    temp = cos*r[i*N+k] + sin*sdiag[i];
		                    sdiag[i] = -sin*r[i*N+k] + cos*sdiag[i];
		                    r[i*N+k] = temp;
		            	}
		            }//71
				}//70
			}//80
		} //90
		//        store the diagonal element of s and restore
		//        the corresponding diagonal element of r.

        sdiag[j] = r[j*N+j];
        r[j*N+j] = x[j];

	}//100

	//     solve the triangular system for z. if the system is
	//     singular, then obtain a least squares solution.

	nsing = N;

	for(j = 1; j <= N;++j) {
		if (sdiag[j-1] == zero && nsing == N) {
			nsing = j - 1;
		}
		if (nsing < N) {
			wa[j-1] = zero;
		}
	}

	if (nsing >= 1) {//150
		for(k = 1; k <= nsing;++k) {
	         j = nsing - k + 1;
	         sum = zero;
	         jp1 = j + 1;

	         if (nsing >= jp1) {
	        	 for (i = jp1; i <= nsing;++i) {
	        		 sum = sum + r[(i-1)*N+j-1]*wa[i-1];
	        	 }
	         }
	         wa[j-1] = (wa[j-1] - sum)/sdiag[j-1];
		}
	}//150

	//     permute the components of z back to components of x.

	for (j = 0; j < N;++j) {
        l = ipvt[j];
        x[l] = wa[j];
	}


	free(wa);
}